

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

void __thiscall
pstore::small_vector<pstore::command_line::literal,_3UL>::small_vector
          (small_vector<pstore::command_line::literal,_3UL> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  literal *plVar2;
  long lVar3;
  
  this->elements_ = 0;
  paVar1 = &(this->small_buffer_)._M_elems[0].description.field_2;
  lVar3 = 0xd8;
  do {
    *(undefined8 *)((long)paVar1 + -0x38) = 0;
    paVar1[-3]._M_allocated_capacity = 0;
    *(undefined8 *)((long)paVar1 + -0x28) = 0;
    paVar1[-2]._M_allocated_capacity = 0;
    *(undefined8 *)((long)paVar1 + -0x18) = 0;
    (((string *)(paVar1 + -1))->_M_dataplus)._M_p = (pointer)0x0;
    *(size_type *)((long)paVar1 + -8) = 0;
    paVar1->_M_allocated_capacity = 0;
    *(undefined8 *)((long)paVar1 + 8) = 0;
    *(undefined8 **)((long)paVar1 + -0x38) = (undefined8 *)((long)paVar1 + -0x28);
    paVar1[-3]._M_allocated_capacity = 0;
    *(undefined1 *)((long)paVar1 + -0x28) = 0;
    *(undefined4 *)((long)paVar1 + -0x18) = 0;
    (((string *)(paVar1 + -1))->_M_dataplus)._M_p = (pointer)paVar1;
    *(size_type *)((long)paVar1 + -8) = 0;
    paVar1->_M_local_buf[0] = '\0';
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar1 + 0x48);
    lVar3 = lVar3 + -0x48;
  } while (lVar3 != 0);
  (this->big_buffer_).
  super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->buffer_ = (literal *)0x0;
  (this->big_buffer_).
  super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->big_buffer_).
  super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  plVar2 = (literal *)0x0;
  if (this->elements_ < 4) {
    plVar2 = (this->small_buffer_)._M_elems;
  }
  this->buffer_ = plVar2;
  return;
}

Assistant:

small_vector<ElementType, BodyElements>::small_vector () noexcept {
        this->set_buffer_ptr (elements_);
    }